

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value,basic_format_specs<char> *specs)

{
  long lVar1;
  buffer_appender<char> bVar2;
  buffer<char> *buf;
  ulong uVar3;
  ulong n;
  
  lVar1 = (long)specs->width;
  if (-1 < lVar1) {
    uVar3 = 0;
    if (lVar1 != 0) {
      uVar3 = lVar1 - 1;
    }
    n = uVar3 >> ((ulong)*(byte *)((long)&basic_data<void>::left_padding_shifts +
                                  (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1 + (specs->fill).size_ * uVar3) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,n,&specs->fill);
    if (*(ulong *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) <
        *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar1 = *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
             0x10) = lVar1 + 1;
    *(char *)(*(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 8) + lVar1) = value;
    bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar2,uVar3 - n,&specs->fill);
    return (buffer_appender<char>)
           bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, F&& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}